

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O2

int hex_encode(void *in_buf,uint in_size,char *out_buf,uint out_size,int lowercase)

{
  uint uVar1;
  char *pcVar2;
  byte *pbVar3;
  char *pcVar4;
  
  pcVar4 = "0123456789abcdef";
  if (lowercase == 0) {
    pcVar4 = "0123456789ABCDEF";
  }
  if (out_buf == (char *)0x0) {
    uVar1 = in_size * 2 | 1;
  }
  else {
    if (out_size < in_size * 2) {
      return -1;
    }
    pbVar3 = (byte *)((ulong)in_size + (long)in_buf);
    pcVar2 = out_buf + out_size;
    uVar1 = 0;
    for (; (in_buf < pbVar3 && (out_buf + 1 < pcVar2)); out_buf = out_buf + 2) {
      *out_buf = pcVar4[*in_buf >> 4];
      out_buf[1] = pcVar4[*in_buf & 0xf];
      in_buf = (void *)((long)in_buf + 1);
      uVar1 = uVar1 + 2;
    }
    if (out_buf < pcVar2) {
      *out_buf = '\0';
      return uVar1;
    }
  }
  return uVar1;
}

Assistant:

int
hex_encode(const void* in_buf, unsigned in_size,
           char* out_buf, unsigned out_size, int lowercase)
{
    static const char lower_xdigits[16] = "0123456789abcdef";
    static const char upper_xdigits[16] = "0123456789ABCDEF";

    const char* xdigits = (lowercase ? lower_xdigits : upper_xdigits);
    const unsigned char* in;
    const unsigned char* in_end;
    char* out;
    char* out_end;

    if(out_buf == NULL)
        return in_size * 2 + 1;

    if(out_size < in_size * 2)
        return -1;

    in = (const unsigned char*) in_buf;
    in_end = in + in_size;
    out = out_buf;
    out_end = out + out_size;

    while(in < in_end  &&  out + 1 < out_end) {
        *out++ = xdigits[(*in & 0xf0) >> 4];
        *out++ = xdigits[(*in & 0x0f)];
        in++;
    }

    /* If enough space in the output buffer, append zero terminator. */
    if(out < out_end)
        *out = '\0';

    return out - out_buf;
}